

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O2

int testSpanTestsSlicingUnbounded(void)

{
  reference piVar1;
  ostream *poVar2;
  int iVar3;
  char *pcVar4;
  Span<int,_18446744073709551615UL> SVar5;
  initializer_list<int> __l;
  Span<int,_18446744073709551615UL> span;
  Span<int,_18446744073709551615UL> sub;
  vector<int,_std::allocator<int>_> values;
  
  span.m_ptr = (pointer)0x200000001;
  span.m_size.m_size = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&span;
  std::vector<int,_std::allocator<int>_>::vector(&values,__l,(allocator_type *)&sub);
  span.m_ptr = (pointer)0x0;
  if ((long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    span.m_ptr = values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  }
  span.m_size.m_size =
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  sub = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice(&span,2);
  if (sub.m_size.m_size.m_size == 2) {
    piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&sub,0);
    if (*piVar1 != 3) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x1cf);
      poVar2 = std::operator<<(poVar2,": error: ");
      pcVar4 = "(sub[0]) == (3)";
      goto LAB_001765cc;
    }
    piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&sub,1);
    if (*piVar1 != 4) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x1d0);
      poVar2 = std::operator<<(poVar2,": error: ");
      pcVar4 = "(sub[1]) == (4)";
      goto LAB_001765cc;
    }
    SVar5 = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice(&span,0);
    if (SVar5.m_size.m_size.m_size == span.m_size.m_size) {
      if (SVar5.m_ptr == span.m_ptr) {
        iVar3 = 0;
        goto LAB_001765ee;
      }
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x1d6);
      poVar2 = std::operator<<(poVar2,": error: ");
      pcVar4 = "(sub.Data()) == (span.Data())";
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x1d5);
      poVar2 = std::operator<<(poVar2,": error: ");
      pcVar4 = "(sub.Size()) == (span.Size())";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x1ce);
    poVar2 = std::operator<<(poVar2,": error: ");
    pcVar4 = "(sub.Size()) == (size_t(2))";
LAB_001765cc:
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  iVar3 = 1;
LAB_001765ee:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  return iVar3;
}

Assistant:

int testSpanTestsSlicingUnbounded()
{
    std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    {
        auto sub = span.Slice(2);
        ML_ASSERT_EQ(sub.Size(), size_t(2));
        ML_ASSERT_EQ(sub[0], 3);
        ML_ASSERT_EQ(sub[1], 4);
    }

    {
        auto sub = span.Slice(0);
        ML_ASSERT_EQ(sub.Size(), span.Size());
        ML_ASSERT_EQ(sub.Data(), span.Data());
    }

    return 0;
}